

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O2

int get_var_perceptual_ai(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  uint uVar6;
  
  uVar5 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar5];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar5];
  iVar3 = get_window_wiener_var(cpi,bsize,mi_row,mi_col);
  uVar6 = (uint)(bVar2 >> 1);
  if ((int)uVar6 <= mi_row) {
    iVar4 = get_window_wiener_var(cpi,bsize,mi_row - uVar6,mi_col);
    if (iVar4 <= iVar3) {
      iVar3 = get_window_wiener_var(cpi,bsize,mi_row - uVar6,mi_col);
    }
  }
  if (mi_row <= (int)((cpi->common).mi_params.mi_rows - (bVar2 + uVar6))) {
    iVar4 = get_window_wiener_var(cpi,bsize,uVar6 + mi_row,mi_col);
    if (iVar4 <= iVar3) {
      iVar3 = get_window_wiener_var(cpi,bsize,uVar6 + mi_row,mi_col);
    }
  }
  uVar6 = (uint)(bVar1 >> 1);
  if ((int)uVar6 <= mi_col) {
    iVar4 = get_window_wiener_var(cpi,bsize,mi_row,mi_col - uVar6);
    if (iVar4 <= iVar3) {
      iVar3 = get_window_wiener_var(cpi,bsize,mi_row,mi_col - uVar6);
    }
  }
  if (mi_col <= (int)((cpi->common).mi_params.mi_cols - (bVar1 + uVar6))) {
    iVar4 = get_window_wiener_var(cpi,bsize,mi_row,uVar6 + mi_col);
    if (iVar4 <= iVar3) {
      iVar3 = get_window_wiener_var(cpi,bsize,mi_row,uVar6 + mi_col);
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int get_var_perceptual_ai(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                 int mi_row, int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  int sb_wiener_var = get_window_wiener_var(cpi, bsize, mi_row, mi_col);

  if (mi_row >= (mi_high / 2)) {
    sb_wiener_var =
        AOMMIN(sb_wiener_var,
               get_window_wiener_var(cpi, bsize, mi_row - mi_high / 2, mi_col));
  }
  if (mi_row <= (cm->mi_params.mi_rows - mi_high - (mi_high / 2))) {
    sb_wiener_var =
        AOMMIN(sb_wiener_var,
               get_window_wiener_var(cpi, bsize, mi_row + mi_high / 2, mi_col));
  }
  if (mi_col >= (mi_wide / 2)) {
    sb_wiener_var =
        AOMMIN(sb_wiener_var,
               get_window_wiener_var(cpi, bsize, mi_row, mi_col - mi_wide / 2));
  }
  if (mi_col <= (cm->mi_params.mi_cols - mi_wide - (mi_wide / 2))) {
    sb_wiener_var =
        AOMMIN(sb_wiener_var,
               get_window_wiener_var(cpi, bsize, mi_row, mi_col + mi_wide / 2));
  }

  return sb_wiener_var;
}